

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall Minisat::MarkArray::~MarkArray(MarkArray *this)

{
  MarkArray *unaff_retaddr;
  
  destroy(unaff_retaddr);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&unaff_retaddr->array);
  return;
}

Assistant:

~MarkArray() { destroy(); }